

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void free_block_hash_buffers(uint32_t *(*block_hash_values) [2],int8_t *(*is_block_same) [3])

{
  int j_1;
  int j;
  int k;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < 3;
        in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
  }
  return;
}

Assistant:

static void free_block_hash_buffers(uint32_t *block_hash_values[2][2],
                                    int8_t *is_block_same[2][3]) {
  for (int k = 0; k < 2; ++k) {
    for (int j = 0; j < 2; ++j) {
      aom_free(block_hash_values[k][j]);
    }

    for (int j = 0; j < 3; ++j) {
      aom_free(is_block_same[k][j]);
    }
  }
}